

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyHttpImpl::ignoreSslErrors(QNetworkReplyHttpImpl *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QNetworkReply QStack_28;
  
  QStack_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0x238);
  if (*(char *)(lVar2 + 0xf8) == '\x01') {
    QNetworkReply::url(&QStack_28);
    bVar3 = QHstsCache::isKnownHost((QHstsCache *)(lVar2 + 0xb8),(QUrl *)&QStack_28);
    QUrl::~QUrl((QUrl *)&QStack_28);
    if (bVar3) goto LAB_001fd25d;
  }
  *(undefined1 *)(lVar1 + 0x360) = 1;
LAB_001fd25d:
  if (*(long *)(in_FS_OFFSET + 0x28) == QStack_28._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::ignoreSslErrors()
{
    Q_D(QNetworkReplyHttpImpl);
    Q_ASSERT(d->managerPrivate);

    if (d->managerPrivate->stsEnabled && d->managerPrivate->stsCache.isKnownHost(url())) {
        // We cannot ignore any Security Transport-related errors for this host.
        return;
    }

    d->pendingIgnoreAllSslErrors = true;
}